

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall icu_63::CollationRuleParser::skipWhiteSpace(CollationRuleParser *this,int32_t i)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  bool bVar4;
  int local_14;
  int32_t i_local;
  CollationRuleParser *this_local;
  
  local_14 = i;
  while( true ) {
    iVar3 = UnicodeString::length(this->rules);
    bVar4 = false;
    if (local_14 < iVar3) {
      cVar2 = UnicodeString::charAt(this->rules,local_14);
      UVar1 = PatternProps::isWhiteSpace((uint)(ushort)cVar2);
      bVar4 = UVar1 != '\0';
    }
    if (!bVar4) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int32_t
CollationRuleParser::skipWhiteSpace(int32_t i) const {
    while(i < rules->length() && PatternProps::isWhiteSpace(rules->charAt(i))) {
        ++i;
    }
    return i;
}